

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void * WindowSettingsHandler_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  ImGuiWindowSettings *pIVar1;
  
  pIVar1 = ImGui::FindOrCreateWindowSettings(name);
  (pIVar1->Pos).x = 0;
  (pIVar1->Pos).y = 0;
  (pIVar1->Size).x = 0;
  (pIVar1->Size).y = 0;
  (pIVar1->ViewportPos).x = 0;
  (pIVar1->ViewportPos).y = 0;
  pIVar1->ViewportId = 0;
  pIVar1->DockId = 0;
  pIVar1->ClassId = 0;
  pIVar1->DockOrder = -1;
  pIVar1->Collapsed = false;
  pIVar1->WantApply = true;
  return pIVar1;
}

Assistant:

static void* WindowSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindOrCreateWindowSettings(name);
    ImGuiID id = settings->ID;
    *settings = ImGuiWindowSettings(); // Clear existing if recycling previous entry
    settings->ID = id;
    settings->WantApply = true;
    return (void*)settings;
}